

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O0

void ssh2_userauth_add_alg_and_publickey
               (ssh2_userauth_state *s,PktOut *pkt,ptrlen alg,ptrlen pkblob)

{
  LogContext *pLVar1;
  bool bVar2;
  _Bool _Var3;
  ssh_keyalg *psVar4;
  strbuf *buf_o;
  strbuf *psVar5;
  ssh_keyalg *self;
  ssh_key *key;
  ssh_key *psVar6;
  char *pcVar7;
  char *pcVar8;
  ptrlen pVar9;
  ptrlen pVar10;
  ssh_keyalg *certalg;
  bool local_89;
  _Bool verbose;
  strbuf *fail_reason;
  ssh_key *pk;
  ssh_key *certkey;
  ssh_keyalg *pkalg;
  strbuf *psStack_60;
  _Bool done;
  strbuf *pkbase;
  strbuf *certbase;
  ptrlen detached_cert_pl;
  PacketProtocolLayer *ppl;
  PktOut *pkt_local;
  ssh2_userauth_state *s_local;
  ptrlen pkblob_local;
  ptrlen alg_local;
  
  if (s->detached_cert_blob == (strbuf *)0x0) goto LAB_001231e1;
  pVar9 = ptrlen_from_strbuf(s->detached_cert_blob);
  pkbase = (strbuf *)0x0;
  psStack_60 = (strbuf *)0x0;
  bVar2 = false;
  psVar4 = find_pubkey_alg_len(alg);
  fail_reason = (strbuf *)0x0;
  buf_o = strbuf_new();
  if (s->cert_pubkey_diagnosed == (strbuf *)0x0) {
    psVar5 = strbuf_new();
    s->cert_pubkey_diagnosed = psVar5;
  }
  pVar10 = ptrlen_from_strbuf(s->cert_pubkey_diagnosed);
  _Var3 = ptrlen_eq_ptrlen(pVar10,pkblob);
  if (!_Var3) {
    strbuf_clear(s->cert_pubkey_diagnosed);
    BinarySink_put_datapl(s->cert_pubkey_diagnosed->binarysink_,pkblob);
  }
  local_89 = !_Var3;
  self = pubkey_blob_to_alg(pVar9);
  if (self == (ssh_keyalg *)0x0) {
    __assert_fail("certalg",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/userauth2-client.c"
                  ,0x767,
                  "void ssh2_userauth_add_alg_and_publickey(struct ssh2_userauth_state *, PktOut *, ptrlen, ptrlen)"
                 );
  }
  if ((self->is_certificate & 1U) == 0) {
    __assert_fail("certalg->is_certificate",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/userauth2-client.c"
                  ,0x768,
                  "void ssh2_userauth_add_alg_and_publickey(struct ssh2_userauth_state *, PktOut *, ptrlen, ptrlen)"
                 );
  }
  key = ssh_key_new_pub(self,pVar9);
  if (key == (ssh_key *)0x0) {
    BinarySink_put_fmt(buf_o->binarysink_,"certificate key file is invalid");
LAB_001230d2:
    if (local_89) {
      pLVar1 = (s->ppl).logctx;
      pcVar7 = filename_to_str(s->detached_cert_file);
      pcVar7 = dupprintf("Not substituting certificate \"%s\" for public key: %s",pcVar7,buf_o->s);
      logevent_and_free(pLVar1,pcVar7);
      if (s->publickey_blob != (strbuf *)0x0) {
        pcVar7 = filename_to_str(s->detached_cert_file);
        pcVar8 = filename_to_str(s->keyfile);
        pcVar7 = dupprintf("Unable to use certificate \"%s\" with public key \"%s\": %s\r\n",pcVar7,
                           pcVar8,buf_o->s);
        ssh_ppl_user_output_string_and_free(&s->ppl,pcVar7);
      }
    }
  }
  else {
    pkbase = strbuf_new();
    psVar6 = ssh_key_base_key(key);
    ssh_key_public_blob(psVar6,pkbase->binarysink_);
    pVar9 = ptrlen_from_strbuf(pkbase);
    _Var3 = ptrlen_eq_ptrlen(pkblob,pVar9);
    if (!_Var3) {
      if (psVar4 == (ssh_keyalg *)0x0) {
        BinarySink_put_fmt(buf_o->binarysink_,"unable to identify algorithm of base key");
      }
      else {
        fail_reason = (strbuf *)ssh_key_new_pub(psVar4,pkblob);
        if (fail_reason == (strbuf *)0x0) {
          BinarySink_put_fmt(buf_o->binarysink_,"base public key is invalid");
        }
        else {
          psStack_60 = strbuf_new();
          psVar6 = ssh_key_base_key((ssh_key *)fail_reason);
          ssh_key_public_blob(psVar6,psStack_60->binarysink_);
          pVar9 = ptrlen_from_strbuf(psStack_60);
          pVar10 = ptrlen_from_strbuf(pkbase);
          _Var3 = ptrlen_eq_ptrlen(pVar9,pVar10);
          if (_Var3) goto LAB_0012300b;
          BinarySink_put_fmt(buf_o->binarysink_,"base public key does not match certificate");
        }
      }
      goto LAB_001230d2;
    }
LAB_0012300b:
    if (local_89) {
      pLVar1 = (s->ppl).logctx;
      pcVar7 = filename_to_str(s->detached_cert_file);
      pcVar7 = dupprintf("Sending public key with certificate from \"%s\"",pcVar7);
      logevent_and_free(pLVar1,pcVar7);
    }
    psVar4 = ssh_keyalg_related_alg(self,psVar4);
    BinarySink_put_stringz(pkt->binarysink_,psVar4->ssh_id);
    pVar9 = ptrlen_from_strbuf(s->detached_cert_blob);
    BinarySink_put_stringpl(pkt->binarysink_,pVar9);
    bVar2 = true;
  }
  if (pkbase != (strbuf *)0x0) {
    strbuf_free(pkbase);
  }
  if (psStack_60 != (strbuf *)0x0) {
    strbuf_free(psStack_60);
  }
  if (key != (ssh_key *)0x0) {
    ssh_key_free(key);
  }
  if (fail_reason != (strbuf *)0x0) {
    ssh_key_free((ssh_key *)fail_reason);
  }
  strbuf_free(buf_o);
  if (bVar2) {
    return;
  }
LAB_001231e1:
  BinarySink_put_stringpl(pkt->binarysink_,alg);
  BinarySink_put_stringpl(pkt->binarysink_,pkblob);
  return;
}

Assistant:

static void ssh2_userauth_add_alg_and_publickey(
    struct ssh2_userauth_state *s, PktOut *pkt, ptrlen alg, ptrlen pkblob)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */

    if (s->detached_cert_blob) {
        ptrlen detached_cert_pl = ptrlen_from_strbuf(s->detached_cert_blob);
        strbuf *certbase = NULL, *pkbase = NULL;
        bool done = false;
        const ssh_keyalg *pkalg = find_pubkey_alg_len(alg);
        ssh_key *certkey = NULL, *pk = NULL;
        strbuf *fail_reason = strbuf_new();
        bool verbose = true;

        /*
         * Whether or not we send the certificate, we're likely to
         * generate a log message about it. But we don't want to log
         * once for the offer and once for the real auth attempt, so
         * we de-duplicate by remembering the last public key this
         * function saw. */
        if (!s->cert_pubkey_diagnosed)
            s->cert_pubkey_diagnosed = strbuf_new();
        if (ptrlen_eq_ptrlen(ptrlen_from_strbuf(s->cert_pubkey_diagnosed),
                             pkblob)) {
            verbose = false;
        } else {
            /* Log this time, but arrange that we don't mention it next time */
            strbuf_clear(s->cert_pubkey_diagnosed);
            put_datapl(s->cert_pubkey_diagnosed, pkblob);
        }

        /*
         * Check that the public key we're replacing is compatible
         * with the certificate, in that they should have the same
         * base public key.
         */

        const ssh_keyalg *certalg = pubkey_blob_to_alg(detached_cert_pl);
        assert(certalg); /* we checked this before setting s->detached_blob */
        assert(certalg->is_certificate); /* and this too */

        certkey = ssh_key_new_pub(certalg, detached_cert_pl);
        if (!certkey) {
            put_fmt(fail_reason, "certificate key file is invalid");
            goto no_match;
        }

        certbase = strbuf_new();
        ssh_key_public_blob(ssh_key_base_key(certkey),
                            BinarySink_UPCAST(certbase));
        if (ptrlen_eq_ptrlen(pkblob, ptrlen_from_strbuf(certbase)))
            goto match;                /* yes, a match! */

        /*
         * If we reach here, the certificate's base key was not
         * identical to the key we're given. But it might still be
         * identical to the _base_ key of the key we're given, if we
         * were using a differently certified version of the same key.
         * In that situation, the detached cert should still override.
         */
        if (!pkalg) {
            put_fmt(fail_reason, "unable to identify algorithm of base key");
            goto no_match;
        }

        pk = ssh_key_new_pub(pkalg, pkblob);
        if (!pk) {
            put_fmt(fail_reason, "base public key is invalid");
            goto no_match;
        }

        pkbase = strbuf_new();
        ssh_key_public_blob(ssh_key_base_key(pk), BinarySink_UPCAST(pkbase));
        if (ptrlen_eq_ptrlen(ptrlen_from_strbuf(pkbase),
                             ptrlen_from_strbuf(certbase)))
            goto match;                /* yes, a match on 2nd attempt! */

        /* Give up; we've tried to match these keys up and failed. */
        put_fmt(fail_reason, "base public key does not match certificate");
        goto no_match;

      match:
        /*
         * The two keys match, so insert the detached certificate into
         * the output packet in place of the public key we were given.
         *
         * However, we need to be a bit careful with the algorithm
         * name: we might need to upgrade it to one that matches the
         * original algorithm name. (If we were asked to add an
         * ssh-rsa key but were given algorithm name "rsa-sha2-512",
         * then instead of the certificate's algorithm name
         * ssh-rsa-cert-v01@... we need to write the corresponding
         * SHA-512 name rsa-sha2-512-cert-v01@... .)
         */
        if (verbose) {
            ppl_logevent("Sending public key with certificate from \"%s\"",
                         filename_to_str(s->detached_cert_file));
        }
        put_stringz(pkt, ssh_keyalg_related_alg(certalg, pkalg)->ssh_id);
        put_stringpl(pkt, ptrlen_from_strbuf(s->detached_cert_blob));
        done = true;
        goto out;

      no_match:
        /* Log that we didn't send the certificate, if this public key
         * isn't the same one as last call to this function. (Need to
         * avoid verbosely logging once for the offer and once for the
         * real auth attempt.) */
	if (verbose) {
            ppl_logevent("Not substituting certificate \"%s\" for public "
                         "key: %s", filename_to_str(s->detached_cert_file),
                         fail_reason->s);
            if (s->publickey_blob) {
                /* If the user provided a specific key file to use (i.e.
                 * this wasn't just a key we picked opportunistically out
                 * of an agent), then they probably _care_ that we didn't
                 * send the certificate, so we should make a loud error
                 * message about it as well as just commenting in the
                 * Event Log. */
                ppl_printf("Unable to use certificate \"%s\" with public "
                           "key \"%s\": %s\r\n",
                           filename_to_str(s->detached_cert_file),
                           filename_to_str(s->keyfile),
                           fail_reason->s);
            }
        }

      out:
        /* Whether we did that or not, free our stuff. */
        if (certbase)
            strbuf_free(certbase);
        if (pkbase)
            strbuf_free(pkbase);
        if (certkey)
            ssh_key_free(certkey);
        if (pk)
            ssh_key_free(pk);
        strbuf_free(fail_reason);

        /* And if we did, don't fall through to the alternative below */
        if (done)
            return;
    }

    /* In all other cases, just put in what we were given. */
    put_stringpl(pkt, alg);
    put_stringpl(pkt, pkblob);
}